

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O1

Hashtable * __thiscall icu_63::ICUService::getVisibleIDMap(ICUService *this,UErrorCode *status)

{
  Hashtable *pHVar1;
  long *plVar2;
  code *p;
  UHashtable *fillinResult;
  int iVar3;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (this->idCache == (Hashtable *)0x0) {
      p = (code *)status;
      pHVar1 = (Hashtable *)UMemory::operator_new((UMemory *)0x58,(size_t)status);
      if (pHVar1 == (Hashtable *)0x0) {
        pHVar1 = (Hashtable *)0x0;
      }
      else {
        pHVar1->hash = (UHashtable *)0x0;
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          fillinResult = &pHVar1->hashObj;
          p = uhash_hashUnicodeString_63;
          uhash_init_63(fillinResult,uhash_hashUnicodeString_63,uhash_compareUnicodeString_63,
                        (undefined1 *)0x0,status);
          if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
            pHVar1->hash = fillinResult;
            p = uprv_deleteUObject_63;
            uhash_setKeyDeleter_63(fillinResult,uprv_deleteUObject_63);
          }
        }
      }
      this->idCache = pHVar1;
      if (pHVar1 == (Hashtable *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
      else if (this->factories != (UVector *)0x0) {
        iVar3 = this->factories->count;
        if (0 < iVar3) {
          iVar3 = iVar3 + 1;
          do {
            plVar2 = (long *)UVector::elementAt(this->factories,iVar3 + -2);
            p = (code *)this->idCache;
            (**(code **)(*plVar2 + 0x20))(plVar2,p,status);
            iVar3 = iVar3 + -1;
          } while (1 < iVar3);
        }
        if (U_ZERO_ERROR < *status) {
          pHVar1 = this->idCache;
          if (pHVar1 != (Hashtable *)0x0) {
            if (pHVar1->hash != (UHashtable *)0x0) {
              uhash_close_63(pHVar1->hash);
            }
            UMemory::operator_delete((UMemory *)pHVar1,p);
          }
          this->idCache = (Hashtable *)0x0;
        }
      }
    }
    pHVar1 = this->idCache;
  }
  else {
    pHVar1 = (Hashtable *)0x0;
  }
  return pHVar1;
}

Assistant:

UnicodeString& 
ICUService::getDisplayName(const UnicodeString& id, UnicodeString& result, const Locale& locale) const 
{
    {
        UErrorCode status = U_ZERO_ERROR;
        Mutex mutex(&lock);
        const Hashtable* map = getVisibleIDMap(status);
        if (map != NULL) {
            ICUServiceFactory* f = (ICUServiceFactory*)map->get(id);
            if (f != NULL) {
                f->getDisplayName(id, locale, result);
                return result;
            }

            // fallback
            status = U_ZERO_ERROR;
            ICUServiceKey* fallbackKey = createKey(&id, status);
            while (fallbackKey != NULL && fallbackKey->fallback()) {
                UnicodeString us;
                fallbackKey->currentID(us);
                f = (ICUServiceFactory*)map->get(us);
                if (f != NULL) {
                    f->getDisplayName(id, locale, result);
                    delete fallbackKey;
                    return result;
                }
            }
            delete fallbackKey;
        }
    }
    result.setToBogus();
    return result;
}